

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcManager.cpp
# Opt level: O0

void __thiscall GrcManager::Init(GrcManager *this)

{
  void *pvVar1;
  GrcSymbolTable *this_00;
  undefined4 *in_RDI;
  GrpLineAndFile *in_stack_ffffffffffffff48;
  GdlRenderer *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  GrpLineAndFile *in_stack_ffffffffffffff60;
  ulong uVar2;
  size_type_conflict in_stack_ffffffffffffff68;
  allocator local_61;
  string local_60 [96];
  
  pvVar1 = operator_new(0x118);
  GdlRenderer::GdlRenderer(in_stack_ffffffffffffff50);
  *(void **)(in_RDI + 0x22) = pvVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"",&local_61);
  GrpLineAndFile::GrpLineAndFile
            (in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             (int)in_stack_ffffffffffffff58,(string *)in_stack_ffffffffffffff50);
  GdlObject::SetLineAndFile(&in_stack_ffffffffffffff50->super_GdlObject,in_stack_ffffffffffffff48);
  GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x1b741f);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  this_00 = (GrcSymbolTable *)operator_new(0x40);
  GrcSymbolTable::GrcSymbolTable(this_00,SUB81(in_stack_ffffffffffffff68 >> 0x38,0));
  *(GrcSymbolTable **)(in_RDI + 0x24) = this_00;
  std::vector<GrcEnv,_std::allocator<GrcEnv>_>::resize
            ((vector<GrcEnv,_std::allocator<GrcEnv>_> *)this_00,in_stack_ffffffffffffff68);
  uVar2 = 0x30;
  pvVar1 = operator_new(0x30);
  GrcMasterTable::GrcMasterTable((GrcMasterTable *)0x1b7492);
  *(void **)(in_RDI + 0x26) = pvVar1;
  pvVar1 = operator_new(uVar2);
  GrcMasterTable::GrcMasterTable((GrcMasterTable *)0x1b74ba);
  *(void **)(in_RDI + 0x28) = pvVar1;
  pvVar1 = operator_new(uVar2);
  GrcMasterValueList::GrcMasterValueList((GrcMasterValueList *)0x1b74e5);
  *(void **)(in_RDI + 0x2a) = pvVar1;
  *(undefined8 *)(in_RDI + 0x82) = 0;
  *(undefined8 *)(in_RDI + 0x8a) = 0;
  *(undefined8 *)(in_RDI + 0x9a) = 0;
  *(undefined1 *)(in_RDI + 0x58) = 0;
  *(undefined1 *)((long)in_RDI + 0x161) = 0;
  *(undefined1 *)(in_RDI + 0x1e) = 0;
  in_RDI[0x20] = 0xffffffff;
  *in_RDI = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[0xa4] = 0;
  return;
}

Assistant:

void GrcManager::Init()
{
	m_prndr = new GdlRenderer();
	m_prndr->SetLineAndFile(GrpLineAndFile(1, 1, ""));

	m_psymtbl = new GrcSymbolTable(true);

	m_venv.resize(1);

	//	Temporary structures used during parsing:
	m_mtbGlyphAttrs = new GrcMasterTable;
	m_mtbFeatures = new GrcMasterTable;
	m_mvlNameStrings = new GrcMasterValueList;

	m_pgax = NULL;
	m_plclist = NULL;

	m_prgvpglfcFsmClasses = NULL;

	m_fOutputDebugFiles = false;
	m_fOutputDebugXml = false;
	m_fBasicJust = false;

	m_nNameTblStart = -1;

	m_fxdSilfTableVersion = 0;
	m_fxdGlocTableVersion = 0;
	m_fxdGlatTableVersion = 0;
	m_fxdFeatTableVersion = 0;
	m_fxdSillTableVersion = 0;
	m_tcCompressor = ktcNone;
}